

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O0

void __thiscall CPU::MOS6502::State::State(State *this)

{
  bool bVar1;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_41;
  string local_40;
  State *local_10;
  State *this_local;
  
  local_10 = this;
  Reflection::StructImpl<CPU::MOS6502::State>::StructImpl
            (&this->super_StructImpl<CPU::MOS6502::State>);
  (this->super_StructImpl<CPU::MOS6502::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__00ca9408;
  Registers::Registers(&this->registers);
  Inputs::Inputs(&this->inputs);
  ExecutionState::ExecutionState(&this->execution_state);
  bVar1 = Reflection::StructImpl<CPU::MOS6502::State>::needs_declare
                    (&this->super_StructImpl<CPU::MOS6502::State>);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"registers",&local_41);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::Registers>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->registers,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"execution_state",&local_69);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::ExecutionState>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->execution_state,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::allocator<char>::~allocator(&local_69);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"inputs",&local_91);
    Reflection::StructImpl<CPU::MOS6502::State>::declare<CPU::MOS6502::State::Inputs>
              (&this->super_StructImpl<CPU::MOS6502::State>,&this->inputs,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return;
}

Assistant:

State::State() {
	if(needs_declare()) {
		DeclareField(registers);
		DeclareField(execution_state);
		DeclareField(inputs);
	}
}